

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
next(cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  long *in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffc8;
  ser_error *in_stack_ffffffffffffffd0;
  error_code local_18;
  
  std::error_code::error_code(in_stack_ffffffffffffffa0);
  (**(code **)(*in_RDI + 0x40))(in_RDI,&local_18);
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::line
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             (in_RDI + 1));
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::column
            ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             0x2faecf);
  ec_00._M_cat = local_18._M_cat;
  ec_00._M_value = local_18._M_value;
  ec_00._4_4_ = local_18._4_4_;
  ser_error::ser_error(in_stack_ffffffffffffffd0,ec_00,in_stack_ffffffffffffffc8,(size_t)in_RDI);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void next() override
        {
            std::error_code ec;
            next(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
            }
        }